

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O2

int thread_pool_init(thread_pool_t *pool,size_t num_threads)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  void *pvVar2;
  thread **pptVar3;
  thread *__newthread;
  char *pcVar4;
  size_t i;
  size_t sVar5;
  size_t sStack_d0;
  sigaction local_c8;
  
  if (pool == (thread_pool_t *)0x0) {
    pcVar4 = "thread_pool_init(): thread_pool is a null pointer.\n";
  }
  else {
    pool->keepAlive = 1;
    pool->num_threads_alive = 0;
    pool->num_threads_working = 0;
    __mutex = (pthread_mutex_t *)malloc(0x48);
    pool->jobqueue = (jobqueue *)__mutex;
    if (__mutex == (pthread_mutex_t *)0x0) {
      pcVar4 = "jobqueue_init(): Malloc failed for job queue.\n";
      sStack_d0 = 0x2e;
      goto LAB_0010263f;
    }
    *(undefined8 *)((long)__mutex + 0x40) = 0;
    pvVar2 = malloc(0x60);
    __mutex[1].__align = 0;
    *(undefined8 *)((long)__mutex + 0x30) = 0;
    *(void **)((long)__mutex + 0x38) = pvVar2;
    if (pvVar2 == (void *)0x0) {
      pcVar4 = "jobqueue_init(): Malloc failed for has_jobs.\n";
      sStack_d0 = 0x2d;
    }
    else {
      sVar5 = 0;
      iVar1 = pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
      if (iVar1 == 0) {
        bsem_init(*(bsem **)((long)__mutex + 0x38),sVar5);
        pptVar3 = (thread **)malloc(num_threads * 8);
        pool->threads = pptVar3;
        if (pptVar3 == (thread **)0x0) {
          fwrite("thread_pool_init(): Malloc failed for creating threads\n",0x37,1,_stderr);
          jobqueue_destroy(pool->jobqueue);
        }
        else {
          iVar1 = pthread_mutex_init((pthread_mutex_t *)&pool->thcount_lock,
                                     (pthread_mutexattr_t *)0x0);
          if (iVar1 == 0) {
            iVar1 = pthread_cond_init((pthread_cond_t *)&pool->threads_idle,
                                      (pthread_condattr_t *)0x0);
            if (iVar1 == 0) {
              memset(&local_c8.sa_mask,0,0x90);
              local_c8.sa_flags = 4;
              local_c8.__sigaction_handler.sa_handler = handler;
              iVar1 = sigaction(2,&local_c8,(sigaction *)0x0);
              if (iVar1 == -1) {
                fwrite("set_sig_handler(): SIGINT signal handling failed.\n",0x32,1,_stderr);
              }
              for (sVar5 = 0; num_threads != sVar5; sVar5 = sVar5 + 1) {
                pptVar3 = pool->threads;
                __newthread = (thread *)malloc(0x10);
                pptVar3[sVar5] = __newthread;
                if (__newthread == (thread *)0x0) {
                  fwrite("thread_init(): Malloc failed for thread initialisation.\n",0x38,1,_stderr)
                  ;
                }
                else {
                  __newthread->thread_pool_p = pool;
                  pthread_create((pthread_t *)__newthread,(pthread_attr_t *)0x0,thread_do,
                                 __newthread);
                  pthread_detach(pptVar3[sVar5]->pthread);
                }
              }
              while (pool->num_threads_alive != num_threads) {
                usleep(100000);
              }
              iVar1 = vector_add(&vec,pool);
              pool->id = iVar1;
              return 0;
            }
            pcVar4 = "thread_pool_init(): condition initialisation failed.\n";
            sStack_d0 = 0x35;
            goto LAB_0010263f;
          }
          fwrite("thread_pool_init(): mutex initialisation failed.\n",0x31,1,_stderr);
          jobqueue_destroy(pool->jobqueue);
          free(pool->threads);
        }
        free(pool);
        return -1;
      }
      pcVar4 = "jobqueue_init(): mutex initialisation failed.\n";
      sStack_d0 = 0x2e;
    }
    fwrite(pcVar4,sStack_d0,1,_stderr);
    pcVar4 = "thread_pool_init(): Initialising job queue failed.\n";
  }
  sStack_d0 = 0x33;
LAB_0010263f:
  fwrite(pcVar4,sStack_d0,1,_stderr);
  return -1;
}

Assistant:

int thread_pool_init(thread_pool_t *pool, size_t num_threads) {
    if (pool == NULL) {
        err("thread_pool_init(): thread_pool is a null pointer.\n");
        return -1;
    }

    pool->keepAlive = 1;
    pool->num_threads_alive = 0;
    pool->num_threads_working = 0;

    /* ThreadPool should have a job queue */
    pool->jobqueue = malloc(sizeof(struct jobqueue));

    if (pool->jobqueue == NULL) {
        err("jobqueue_init(): Malloc failed for job queue.\n");
        return -1;
    }

    if (jobqueue_init(pool->jobqueue) == -1) {
        err("thread_pool_init(): Initialising job queue failed.\n");
        return -1;
    }

    /* Creating the threads in the thread pool */
    pool->threads = malloc(num_threads * sizeof(struct thread *));
    if (pool->threads == NULL) {
        err("thread_pool_init(): Malloc failed for creating threads\n");
        jobqueue_destroy(pool->jobqueue);
        free(pool);
        return -1;
    }

    /* Initialise mutex and condition in thread pool */
    if (pthread_mutex_init(&pool->thcount_lock, 0)) {
        err("thread_pool_init(): mutex initialisation failed.\n");
        jobqueue_destroy(pool->jobqueue);
        free(pool->threads);
        free(pool);
        return -1;
    }

    if (pthread_cond_init(&pool->threads_idle, 0) != 0) {
        err("thread_pool_init(): condition initialisation failed.\n");
        return -1;
    }

    set_sig_handler();

    for (size_t i = 0; i < num_threads; ++i) {
        thread_init(pool, &pool->threads[i]);
    }

    /* Waiting to all threads to be initialised */
    while (pool->num_threads_alive != num_threads) {
        usleep(100 * 1000);
    }

    int id = vector_add(&vec, pool);

    /* Id is the index of the pool in the vector of the pools. */
    pool->id = id;

    return 0;
}